

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O1

fnode_service_t * fnode_service_create(char *sn,char *dev_type)

{
  fnode_service_t *__s;
  size_t sVar1;
  
  __s = (fnode_service_t *)malloc(0x4c0);
  if (__s == (fnode_service_t *)0x0) {
    __s = (fnode_service_t *)0x0;
  }
  else {
    memset(__s,0,0x4c0);
    __s->ref_counter = 1;
    *(undefined8 *)__s->sn = *(undefined8 *)sn;
    *(undefined4 *)__s->dev_type = *(undefined4 *)dev_type;
    __s->state = FSVC_INIT;
    __s->socket = 0xffffffff;
    fnet_socket_init();
    sVar1 = fnet_socket_bind_all(FNET_SOCK_DGRAM,__s->ifaces,0x100,1);
    __s->ifaces_num = sVar1;
  }
  return __s;
}

Assistant:

fnode_service_t *fnode_service_create(char const sn[FSN_LENGTH], char const dev_type[FDEV_TYPE_LENGTH])
{
    fnode_service_t *svc = malloc(sizeof(fnode_service_t));
    if (!svc)
    {
        FLOG_ERR("Unable to allocate memory for nodes interlink");
        return 0;
    }
    memset(svc, 0, sizeof *svc);

    svc->ref_counter = 1;
    memcpy(svc->sn, sn, FSN_LENGTH);
    memcpy(svc->dev_type, dev_type, FDEV_TYPE_LENGTH);
    svc->state = FSVC_INIT;
    svc->socket = FNET_INVALID_SOCKET;

    fnet_socket_init();
    fnode_service_create_iface_sockets(svc);

    return svc;
}